

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O2

wchar_t display_page(equippable_summary *s,player *p,_Bool allow_reconfig)

{
  wchar_t wVar1;
  equippable_source eVar2;
  wchar_t wVar3;
  long lVar4;
  size_t sVar5;
  wchar_t *pwVar6;
  wchar_t wVar7;
  uint uVar8;
  wchar_t wVar9;
  undefined7 in_register_00000011;
  wchar_t wVar10;
  long lVar11;
  prop_category *ppVar12;
  equippable *peVar13;
  long lVar14;
  ui_entry_details rdetails;
  
  if (((int)CONCAT71(in_register_00000011,allow_reconfig) != 0) &&
     (wVar3 = reconfigure_for_term_if_necessary(true,p,s), wVar3 != L'\0')) {
    return L'\x01';
  }
  rdetails.label_position.x = s->nshortnm + s->icol_name + L'\x01';
  wVar3 = s->irow_combined_equip;
  rdetails.label_position.y = wVar3 - s->nproplab;
  rdetails.value_position.x = rdetails.label_position.x;
  rdetails.value_position.y = wVar3;
  rdetails.position_step = (loc)loc(1,0);
  rdetails.combined_position = (loc)loc(0,0);
  rdetails.vertical_label = false;
  rdetails.alternate_color_first = false;
  rdetails.show_combined = false;
  Term_putch(s->icol_name + L'\xfffffffc',wVar3,L'\x01',L'@');
  uVar8 = 0;
  for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
    ppVar12 = s->propcats + lVar14;
    lVar4 = (long)s->iview;
    wVar3 = ppVar12->nvw[lVar4];
    if (wVar3 != L'\0') {
      for (wVar10 = L'\0'; wVar10 < wVar3; wVar10 = wVar10 + L'\x01') {
        lVar4 = (long)wVar10 + (long)ppVar12->ivw[(int)lVar4];
        for (lVar11 = 0; lVar11 < s->nproplab; lVar11 = lVar11 + 1) {
          Term_putch(rdetails.label_position.x,rdetails.label_position.y + (int)lVar11,
                     (uVar8 & 1) * 8 + L'\x01',ppVar12->labels[lVar4][lVar11]);
        }
        rdetails.known_rune = is_ui_entry_for_known_rune(ppVar12->entries[lVar4],p);
        wVar3 = get_ui_entry_renderer_index(ppVar12->entries[lVar4]);
        ui_entry_renderer_apply
                  (wVar3,(wchar_t *)0x0,L'\0',s->p_and_eq_vals + lVar4 + ppVar12->off,
                   s->p_and_eq_auxvals + lVar4 + ppVar12->off,L'\x01',&rdetails);
        rdetails.label_position.x = rdetails.label_position.x + L'\x01';
        rdetails.value_position.x = rdetails.value_position.x + L'\x01';
        rdetails.alternate_color_first = (_Bool)(rdetails.alternate_color_first ^ 1);
        uVar8 = uVar8 + 1;
        lVar4 = (long)s->iview;
        wVar3 = ppVar12->nvw[lVar4];
      }
    }
  }
  wVar3 = L'\0';
  while( true ) {
    rdetails.value_position.y = rdetails.value_position.y + L'\x01';
    if (s->npage <= wVar3) {
      return L'\0';
    }
    wVar10 = s->indinc * wVar3 + s->ifirst;
    if ((wVar10 < L'\0') || (s->nfilt <= wVar10)) break;
    wVar1 = s->sorted_indices[(uint)wVar10];
    if (((long)wVar1 < 0) || (s->nitems <= wVar1)) {
      __assert_fail("isort >= 0 && isort < s->nitems",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                    ,0xac9,
                    "int display_page(struct equippable_summary *, const struct player *, _Bool)");
    }
    peVar13 = s->items + wVar1;
    if ((tile_width == '\x01') && (tile_height == '\x01')) {
      wVar9 = (wchar_t)peVar13->at;
      wVar7 = peVar13->ch;
    }
    else {
      wVar9 = L'\x01';
      wVar7 = L' ';
    }
    Term_putch(s->icol_name + L'\xfffffffc',rdetails.value_position.y,wVar9,wVar7);
    wVar9 = rdetails.value_position.y;
    wVar7 = s->icol_name;
    eVar2 = peVar13->src;
    if (source_to_char_first_call == '\0') {
      sVar5 = text_mbstowcs((wchar_t *)source_to_char_wchars,"epfhs ",L'\a');
      if (sVar5 == 0xffffffffffffffff) {
        quit("Invalid encoding for item location codes");
      }
      source_to_char_first_call = '\x01';
    }
    pwVar6 = (wchar_t *)(source_to_char_wchars + 0x14);
    if (eVar2 < (EQUIP_SOURCE_STORE|EQUIP_SOURCE_PACK)) {
      pwVar6 = *(wchar_t **)(&DAT_00285b08 + (ulong)eVar2 * 8);
    }
    Term_putch(wVar7 + L'\xfffffffe',wVar9,L'\x01',*pwVar6);
    wVar9 = L'\x0e';
    wVar7 = wVar9;
    if (((wVar1 != s->isel0) && (wVar1 != s->isel1)) && (wVar7 = L'\x01', wVar10 == s->work_sel)) {
      wVar7 = wVar9;
    }
    Term_putstr(s->icol_name,rdetails.value_position.y,peVar13->nmlen,wVar7,peVar13->short_name);
    rdetails.value_position.x = s->nshortnm + s->icol_name + L'\x01';
    rdetails.alternate_color_first = false;
    for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
      ppVar12 = s->propcats + lVar14;
      lVar4 = (long)s->iview;
      wVar10 = ppVar12->nvw[lVar4];
      if (wVar10 != L'\0') {
        for (lVar11 = 0; (wchar_t)lVar11 < wVar10; lVar11 = lVar11 + 1) {
          lVar4 = ppVar12->ivw[(int)lVar4] + lVar11;
          wVar10 = get_ui_entry_renderer_index(ppVar12->entries[lVar4]);
          ui_entry_renderer_apply
                    (wVar10,(wchar_t *)0x0,L'\0',peVar13->vals + lVar4 + ppVar12->off,
                     peVar13->auxvals + lVar4 + ppVar12->off,L'\x01',&rdetails);
          rdetails.value_position.x = rdetails.value_position.x + L'\x01';
          rdetails.alternate_color_first = (_Bool)(rdetails.alternate_color_first ^ 1);
          lVar4 = (long)s->iview;
          wVar10 = ppVar12->nvw[lVar4];
        }
      }
    }
    wVar3 = wVar3 + L'\x01';
  }
  __assert_fail("icnv >= 0 && icnv < s->nfilt",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                ,0xac7,"int display_page(struct equippable_summary *, const struct player *, _Bool)"
               );
}

Assistant:

static int display_page(struct equippable_summary *s, const struct player *p,
	bool allow_reconfig)
{
	struct ui_entry_details rdetails;
	int color = (COLOUR_WHITE);
	int i, ilab;

	/* Try to handle terminal size changes while displaying the summary. */
	if (allow_reconfig) {
		if (reconfigure_for_term_if_necessary(true, p, s)) {
			return 1;
		}
	}

	/*
	 * Display the column labels and the combined values for @ and the
	 * current equipment.  The display of the labels bypasses what's
	 * done by ui_entry_renderer_apply() so the color of the label can
	 * alternate between columns.
	 */
	rdetails.label_position.x = s->icol_name + s->nshortnm + 1;
	rdetails.label_position.y = s->irow_combined_equip - s->nproplab;
	rdetails.value_position.x = rdetails.label_position.x;
	rdetails.value_position.y = s->irow_combined_equip;
	rdetails.position_step = loc(1, 0);
	rdetails.combined_position = loc(0, 0);
	rdetails.vertical_label = false;
	rdetails.alternate_color_first = false;
	rdetails.show_combined = false;
	Term_putch(s->icol_name - 4, rdetails.value_position.y, color, L'@');
	for (i = 0, ilab = 0; i < (int)N_ELEMENTS(s->propcats); ++i) {
		int j;

		if (!s->propcats[i].nvw[s->iview]) {
			continue;
		}
		for (j = 0; j < s->propcats[i].nvw[s->iview]; ++j, ++ilab) {
			int joff = j + s->propcats[i].ivw[s->iview];
			/*
			 * As a hack, label colors are hardwired; it would be
			 * better if they configurable so they'd be consistent
			 * with the scheme for the symbol colors.
			 */
			int label_color = (ilab % 2 == 0) ?
				COLOUR_WHITE : COLOUR_L_WHITE;
			int k;

			for (k = 0; k < s->nproplab; ++k) {
				Term_putch(rdetails.label_position.x,
					rdetails.label_position.y + k,
					label_color,
					s->propcats[i].labels[joff][k]);
			}
			rdetails.known_rune = is_ui_entry_for_known_rune(
				s->propcats[i].entries[joff], p);
			ui_entry_renderer_apply(get_ui_entry_renderer_index(
				s->propcats[i].entries[joff]), NULL, 0,
				s->p_and_eq_vals + joff + s->propcats[i].off,
				s->p_and_eq_auxvals + joff +
				s->propcats[i].off, 1, &rdetails);
			++rdetails.label_position.x;
			++rdetails.value_position.x;
			rdetails.alternate_color_first =
				!rdetails.alternate_color_first;
		}
	}

	/* Display the items available on the current page. */
	++rdetails.value_position.y;
	for (i = 0; i < s->npage; ++i) {
		const struct equippable *e;
		int icnv, isort, j, nmcolor;

		icnv = s->ifirst + s->indinc * i;
		assert(icnv >= 0 && icnv < s->nfilt);
		isort = s->sorted_indices[icnv];
		assert(isort >= 0 && isort < s->nitems);
		e = s->items + isort;

		if (tile_width == 1 && tile_height == 1) {
			Term_putch(s->icol_name - 4, rdetails.value_position.y,
				e->at, e->ch);
		} else {
			/* No equippy chars with big tiles. */
			Term_putch(s->icol_name - 4, rdetails.value_position.y,
				COLOUR_WHITE, L' ');
		}
		Term_putch(s->icol_name - 2, rdetails.value_position.y, color,
			source_to_char(e->src));
		if (isort == s->isel0 || isort == s->isel1 ||
			icnv == s->work_sel) {
			nmcolor = (COLOUR_L_BLUE);
		} else {
			nmcolor = color;
		}
		Term_putstr(s->icol_name, rdetails.value_position.y,
			e->nmlen, nmcolor, e->short_name);
		rdetails.value_position.x = s->icol_name + s->nshortnm + 1;
		rdetails.alternate_color_first = false;
		for (j = 0; j < (int)N_ELEMENTS(s->propcats); ++j) {
			int k;

			if (!s->propcats[j].nvw[s->iview]) {
				continue;
			}
			for (k = 0; k < s->propcats[j].nvw[s->iview]; ++k) {
				int koff = k + s->propcats[j].ivw[s->iview];

				ui_entry_renderer_apply(
					get_ui_entry_renderer_index(
					s->propcats[j].entries[koff]), NULL, 0,
					e->vals + koff + s->propcats[j].off,
					e->auxvals + koff + s->propcats[j].off,
					1, &rdetails);
				++rdetails.value_position.x;
				rdetails.alternate_color_first =
					!rdetails.alternate_color_first;
			}
		}
		++rdetails.value_position.y;
	}

	return 0;
}